

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O3

bool google::protobuf::
     InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
               (hash_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  size_type __bkt;
  __buckets_ptr pp_Var5;
  long lVar6;
  __node_ptr p_Var7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  char cVar9;
  key_type *__key;
  size_type __n;
  ulong uVar10;
  _Hash_node_base _Var11;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  undefined1 auVar14 [16];
  __buckets_alloc_type __alloc;
  pointer __ptr_1;
  new_allocator<std::__detail::_Hash_node_base_*> local_39;
  _Hash_node_base *local_38;
  
  p_Var3 = (_Hash_node_base *)key->first;
  p_Var4 = (_Hash_node_base *)key->second;
  cVar9 = *(char *)&p_Var4->_M_nxt;
  if (cVar9 == '\0') {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    p_Var13 = p_Var4;
    do {
      p_Var13 = (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1);
      lVar6 = (long)cVar9 + lVar6 * 5;
      cVar9 = *(char *)&p_Var13->_M_nxt;
    } while (cVar9 != '\0');
  }
  p_Var13 = (_Hash_node_base *)((long)p_Var3 * 0xffff + lVar6);
  __bkt = (collection->
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
          )._M_h._M_bucket_count;
  __key = (key_type *)((ulong)p_Var13 % __bkt);
  p_Var7 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(collection->
                             super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                             )._M_h._M_buckets,__bkt,__key,(__hash_code)p_Var3);
  if (p_Var7 == (__node_ptr)0x0) {
    local_38 = (_Hash_node_base *)operator_new(0x28);
    local_38->_M_nxt = (_Hash_node_base *)0x0;
    local_38[1]._M_nxt = p_Var3;
    local_38[2]._M_nxt = p_Var4;
    local_38[3]._M_nxt = (_Hash_node_base *)value;
    auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(collection->
                                 super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                 )._M_h._M_rehash_policy,
                         (collection->
                         super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                         )._M_h._M_bucket_count,
                         (collection->
                         super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                         )._M_h._M_element_count);
    __n = auVar14._8_8_;
    if ((auVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (collection->
            super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
            )._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(collection->
               super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
               )._M_h._M_single_bucket;
        (collection->
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
        )._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_39,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var11._M_nxt =
           (collection->
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
           )._M_h._M_before_begin._M_nxt;
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var11._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(collection->
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  )._M_h._M_before_begin;
        uVar12 = 0;
        do {
          p_Var3 = (_Var11._M_nxt)->_M_nxt;
          uVar10 = (ulong)_Var11._M_nxt[4]._M_nxt % __n;
          if (__s[uVar10] == (_Hash_node_base *)0x0) {
            (_Var11._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var11._M_nxt;
            __s[uVar10] = p_Var1;
            if ((_Var11._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var8 = __s + uVar12;
              goto LAB_002d41e5;
            }
          }
          else {
            (_Var11._M_nxt)->_M_nxt = __s[uVar10]->_M_nxt;
            pp_Var8 = &__s[uVar10]->_M_nxt;
            uVar10 = uVar12;
LAB_002d41e5:
            *pp_Var8 = _Var11._M_nxt;
          }
          _Var11._M_nxt = p_Var3;
          uVar12 = uVar10;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var5 = (collection->
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                )._M_h._M_buckets;
      if (&(collection->
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
           )._M_h._M_single_bucket != pp_Var5) {
        operator_delete(pp_Var5,(collection->
                                super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                )._M_h._M_bucket_count << 3);
      }
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_bucket_count = __n;
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_buckets = __s;
      __key = (key_type *)((ulong)p_Var13 % __n);
    }
    local_38[4]._M_nxt = p_Var13;
    if (__s[(long)__key] == (_Hash_node_base *)0x0) {
      p_Var7 = (__node_ptr)
               (collection->
               super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
               )._M_h._M_before_begin._M_nxt;
      local_38->_M_nxt = (_Hash_node_base *)p_Var7;
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_before_begin._M_nxt = local_38;
      if (p_Var7 != (__node_ptr)0x0) {
        uVar12 = (p_Var7->
                 super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_true>
                 ).super__Hash_node_code_cache<true>._M_hash_code;
        uVar10 = (collection->
                 super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                 )._M_h._M_bucket_count;
        p_Var7 = (__node_ptr)(uVar12 / uVar10);
        __s[uVar12 % uVar10] = local_38;
        __s = (collection->
              super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
              )._M_h._M_buckets;
      }
      __s[(long)__key] =
           &(collection->
            super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
            )._M_h._M_before_begin;
    }
    else {
      local_38->_M_nxt = __s[(long)__key]->_M_nxt;
      p_Var7 = (__node_ptr)__s[(long)__key];
      (p_Var7->super__Hash_node_base)._M_nxt = local_38;
    }
    psVar2 = &(collection->
              super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
              )._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return SUB81(p_Var7,0);
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}